

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_Jump(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                    VMReturn *ret,int numret)

{
  int iVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  uint uVar4;
  undefined8 uVar5;
  PClass *pPVar6;
  FState *val;
  ulong uVar7;
  char *pcVar8;
  bool bVar9;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (0 < numparam) {
    if (((param->field_0).field_3.Type != '\x03') ||
       (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
LAB_003c8681:
      pcVar8 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_003c86d4;
    }
    puVar2 = (undefined8 *)(param->field_0).field_1.a;
    if (puVar2 != (undefined8 *)0x0) {
      if (puVar2[1] == 0) {
        uVar5 = (**(code **)*puVar2)(puVar2);
        puVar2[1] = uVar5;
      }
      pPVar6 = (PClass *)puVar2[1];
      bVar9 = pPVar6 != (PClass *)0x0;
      if (pPVar6 != pPVar3 && bVar9) {
        do {
          pPVar6 = pPVar6->ParentClass;
          bVar9 = pPVar6 != (PClass *)0x0;
          if (pPVar6 == pPVar3) break;
        } while (pPVar6 != (PClass *)0x0);
      }
      if (!bVar9) {
        pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_003c86d4;
      }
    }
    pPVar3 = AActor::RegistrationInfo.MyClass;
    if (numparam != 1) {
      if ((param[1].field_0.field_3.Type != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_003c8681;
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar2 != (undefined8 *)0x0) {
        if (puVar2[1] == 0) {
          uVar5 = (**(code **)*puVar2)(puVar2);
          puVar2[1] = uVar5;
        }
        pPVar6 = (PClass *)puVar2[1];
        bVar9 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar3 && bVar9) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar9 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar3) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if (!bVar9) {
          pcVar8 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003c86d4;
        }
      }
      if (2 < numparam) {
        if (param[2].field_0.field_3.Type == '\x03') {
          if (numparam == 3) {
            pcVar8 = "(paramnum) < numparam";
          }
          else {
            if (param[3].field_0.field_3.Type == '\0') {
              if ((4 < numparam) &&
                 ((iVar1 = param[3].field_0.i, 0xff < iVar1 ||
                  (uVar4 = FRandom::GenRand32(&pr_cajump), (int)(uVar4 & 0xff) < iVar1)))) {
                uVar7 = 4;
                if (numparam + -4 != 1) {
                  uVar4 = FRandom::GenRand32(&pr_cajump);
                  uVar7 = (ulong)((int)((long)(ulong)(uVar4 & 0xff) % (long)(numparam + -4)) + 4);
                }
                if ((int)uVar7 < numparam) {
                  if (param[uVar7].field_0.field_3.Type == '\0') {
                    iVar1 = param[uVar7].field_0.i;
                    if (puVar2[1] == 0) {
                      uVar5 = (**(code **)*puVar2)(puVar2);
                      puVar2[1] = uVar5;
                    }
                    val = FStateLabelStorage::GetState
                                    (&StateLabels,iVar1,(PClassActor *)puVar2[1],false);
                    if (numret < 1) {
                      return 0;
                    }
                    if (ret == (VMReturn *)0x0) {
                      __assert_fail("ret != NULL",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                    ,0x49b,
                                    "int AF_AActor_A_Jump(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                   );
                    }
                    goto LAB_003c865a;
                  }
                  pcVar8 = "param[paramnum + jumpnum].Type == REGT_INT";
                }
                else {
                  pcVar8 = "(paramnum + jumpnum) < numparam";
                }
                __assert_fail(pcVar8,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                              ,0x49a,
                              "int AF_AActor_A_Jump(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
              if (numret < 1) {
                return 0;
              }
              if (ret == (VMReturn *)0x0) {
                __assert_fail("ret != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                              ,0x49d,
                              "int AF_AActor_A_Jump(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
              val = (FState *)0x0;
LAB_003c865a:
              VMReturn::SetPointer(ret,val,0);
              return 1;
            }
            pcVar8 = "param[paramnum].Type == REGT_INT";
          }
          __assert_fail(pcVar8,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x493,
                        "int AF_AActor_A_Jump(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
        }
        pcVar8 = "param[paramnum].Type == REGT_POINTER";
        goto LAB_003c86d4;
      }
    }
  }
  pcVar8 = "(paramnum) < numparam";
LAB_003c86d4:
  __assert_fail(pcVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x492,"int AF_AActor_A_Jump(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Jump)
{
	PARAM_ACTION_PROLOGUE(AActor);
	PARAM_INT(maxchance);

	paramnum++;		// Increment paramnum to point at the first jump target
	int count = numparam - paramnum;
	if (count > 0 && (maxchance >= 256 || pr_cajump() < maxchance))
	{
		int jumpnum = (count == 1 ? 0 : (pr_cajump() % count));
		PARAM_STATE_ACTION_AT(paramnum + jumpnum, jumpto);
		ACTION_RETURN_STATE(jumpto);
	}
	ACTION_RETURN_STATE(NULL);
}